

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Object3D * __thiscall SceneParser::parseObject(SceneParser *this,char *token)

{
  int iVar1;
  Mesh *local_20;
  Object3D *answer;
  char *token_local;
  SceneParser *this_local;
  
  iVar1 = strcmp(token,"Group");
  if (iVar1 == 0) {
    local_20 = (Mesh *)parseGroup(this);
  }
  else {
    iVar1 = strcmp(token,"Sphere");
    if (iVar1 == 0) {
      local_20 = (Mesh *)parseSphere(this);
    }
    else {
      iVar1 = strcmp(token,"Torus");
      if (iVar1 == 0) {
        local_20 = (Mesh *)parseTorus(this);
      }
      else {
        iVar1 = strcmp(token,"Plane");
        if (iVar1 == 0) {
          local_20 = (Mesh *)parsePlane(this);
        }
        else {
          iVar1 = strcmp(token,"Area");
          if (iVar1 == 0) {
            local_20 = (Mesh *)parseArea(this);
          }
          else {
            iVar1 = strcmp(token,"Triangle");
            if (iVar1 == 0) {
              local_20 = (Mesh *)parseTriangle(this);
            }
            else {
              iVar1 = strcmp(token,"TriangleMesh");
              if (iVar1 == 0) {
                local_20 = parseTriangleMesh(this);
              }
              else {
                iVar1 = strcmp(token,"Transform");
                if (iVar1 != 0) {
                  printf("Unknown token in parseObject: \'%s\'\n",token);
                  exit(0);
                }
                local_20 = (Mesh *)parseTransform(this);
              }
            }
          }
        }
      }
    }
  }
  return &local_20->super_Object3D;
}

Assistant:

Object3D *
SceneParser::parseObject(char token[MAX_PARSER_TOKEN_LENGTH]) {
    Object3D *answer = nullptr;
    if (!strcmp(token, "Group")) {
        answer = (Object3D *) parseGroup();
    } else if (!strcmp(token, "Sphere")) {
        answer = (Object3D *) parseSphere();
    } else if (!strcmp(token, "Torus")) {
        answer = (Object3D *) parseTorus();
    } else if (!strcmp(token, "Plane")) {
        answer = (Object3D *) parsePlane();
    } else if (!strcmp(token, "Area")) {
        answer = (Object3D *) parseArea();
    } else if (!strcmp(token, "Triangle")) {
        answer = (Object3D *) parseTriangle();
    } else if (!strcmp(token, "TriangleMesh")) {
        answer = (Object3D *) parseTriangleMesh();
    } else if (!strcmp(token, "Transform")) {
        answer = (Object3D *) parseTransform();
    } else {
        printf("Unknown token in parseObject: '%s'\n", token);
        exit(0);
    }
    return answer;
}